

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  char *pcVar2;
  String *p;
  String *pSVar3;
  long lVar4;
  undefined7 in_register_00000011;
  char *__n;
  ulong uVar5;
  size_t size;
  char *__src;
  kj *this_00;
  long lVar6;
  String *p_1;
  char *__dest;
  Fault f;
  DebugComparison<char_*&,_char_*> _kjCondition;
  Fault local_68;
  char *local_60;
  DebugComparison<char_*&,_char_*> local_58;
  
  uVar5 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar1 = (this->parts).size_;
  if (sVar1 == 0) {
    if ((byte)uVar5 == 0) {
      this_00 = (kj *)0x1e4a32;
    }
    else {
      this_00 = (kj *)0x20b956;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    pSVar3 = (this->parts).ptr;
    size = sVar1 - (byte)((byte)uVar5 ^ 1);
    for (lVar4 = sVar1 * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      sVar1 = (pSVar3->content).size_;
      lVar6 = sVar1 - 1;
      if (sVar1 == 0) {
        lVar6 = 0;
      }
      size = size + lVar6;
      pSVar3 = pSVar3 + 1;
    }
    heapString(__return_storage_ptr__,size);
    local_60 = (char *)(__return_storage_ptr__->content).size_;
    if (local_60 != (char *)0x0) {
      local_60 = (__return_storage_ptr__->content).ptr;
    }
    pSVar3 = (this->parts).ptr;
    for (lVar4 = (this->parts).size_ * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      __dest = local_60;
      if ((uVar5 & 1) != 0) {
        *local_60 = '/';
        __dest = local_60 + 1;
      }
      pcVar2 = (char *)(pSVar3->content).size_;
      __src = pcVar2;
      if (pcVar2 != (char *)0x0) {
        __src = (pSVar3->content).ptr;
      }
      __n = pcVar2 + -1;
      if (pcVar2 == (char *)0x0) {
        __n = (char *)0x0;
      }
      memcpy(__dest,__src,(size_t)__n);
      sVar1 = (pSVar3->content).size_;
      local_60 = (char *)(sVar1 - 1);
      if (sVar1 == 0) {
        local_60 = (char *)0x0;
      }
      local_60 = __dest + (long)local_60;
      pSVar3 = pSVar3 + 1;
      uVar5 = 1;
    }
    sVar1 = (__return_storage_ptr__->content).size_;
    local_58.right = (__return_storage_ptr__->content).ptr + (sVar1 - 1);
    if (sVar1 == 0) {
      local_58.right = (char *)0x0;
    }
    local_58.left = &local_60;
    local_58.op.content.ptr = " == ";
    local_58.op.content.size_ = 5;
    local_58.result = local_60 == local_58.right;
    if (!local_58.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x9a,FAILED,"ptr == result.end()","_kjCondition,",&local_58);
      kj::_::Debug::Fault::fatal(&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}